

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::AppendExpr
          (BinaryReaderIR *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *expr)

{
  intrusive_list<wabt::Expr> *this_00;
  bool bVar1;
  pointer pEVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_58;
  Enum local_4c;
  LabelNode *local_48;
  LabelNode *label;
  size_type local_38;
  anon_union_16_2_ecfd7102_for_Location_1 local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *local_20;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *expr_local;
  BinaryReaderIR *this_local;
  
  local_20 = expr;
  expr_local = (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this;
  GetLocation((Location *)&label,this);
  pEVar2 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::operator->(expr);
  (pEVar2->loc).filename.data_ = (char *)label;
  (pEVar2->loc).filename.size_ = local_38;
  (pEVar2->loc).field_1.field_1.offset = (size_t)local_30.field_1.offset;
  *(undefined8 *)((long)&(pEVar2->loc).field_1 + 8) = local_30._8_8_;
  local_4c = (Enum)TopLabel(this,&local_48);
  bVar1 = Failed((Result)local_4c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = local_48->exprs;
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr(&local_58,expr);
    intrusive_list<wabt::Expr>::push_back(this_00,&local_58);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_58);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::AppendExpr(std::unique_ptr<Expr> expr) {
  expr->loc = GetLocation();
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  label->exprs->push_back(std::move(expr));
  return Result::Ok;
}